

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

AST * __thiscall jsonnet::internal::anon_unknown_0::Parser::parse(Parser *this,uint max_precedence)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *ppFVar2;
  Allocator *pAVar3;
  _List_node_base *p_Var4;
  pointer pcVar5;
  bool bVar6;
  __uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_> _Var7;
  int iVar8;
  _Head_base<0UL,_jsonnet::internal::Token_*,_false> this_00;
  LiteralString *pLVar9;
  Identifier *pIVar10;
  pointer pBVar11;
  Token *this_01;
  AST *pAVar12;
  Function *pFVar13;
  StaticError *pSVar14;
  void *pvVar15;
  Fodder *args_2;
  bool trailing_comma;
  bool is_function;
  __uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
  local_510;
  AST *cond;
  AST *local_500;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8;
  Token semicolon;
  AST *rest;
  pointer pAStack_420;
  pointer local_418;
  AST *msg;
  pointer pAStack_400;
  pointer local_3f8;
  unique_ptr<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_> begin_;
  LiteralString *lit;
  undefined1 local_3c8 [8];
  undefined1 local_3c0 [96];
  undefined1 local_360 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340 [3];
  Token tok;
  Binds binds;
  Fodder fodder_r;
  Identifier *id;
  Fodder colonFodder;
  _Alloc_hider local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Alloc_hider local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  LocationRange local_a8;
  ArgParams local_68;
  Fodder fodder_l;
  
  this_00._M_head_impl = (Token *)operator_new(0xc0);
  Token::Token(this_00._M_head_impl,
               (Token *)((this->tokens->
                         super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                         )._M_impl._M_node.super__List_node_base._M_next + 1));
  pFVar13 = (Function *)0x0;
  local_510._M_t.
  super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
  .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
       (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
       (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
       this_00._M_head_impl;
  begin_._M_t.
  super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>.
  _M_t.
  super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
  .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
       (__uniq_ptr_data<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>,_true,_true>
        )(__uniq_ptr_data<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>,_true,_true>
          )this_00._M_head_impl;
  switch((this_00._M_head_impl)->kind) {
  case ASSERT:
    Token::Token(&tok,(Token *)((this->tokens->
                                super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                                )._M_impl._M_node.super__List_node_base._M_next + 1));
    std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
    _M_erase(this->tokens,
             (this->tokens->
             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>).
             _M_impl._M_node.super__List_node_base._M_next);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tok.location.file._M_dataplus._M_p != &tok.location.file.field_2) {
      operator_delete(tok.location.file._M_dataplus._M_p,
                      tok.location.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tok.stringBlockTermIndent._M_dataplus._M_p != &tok.stringBlockTermIndent.field_2) {
      operator_delete(tok.stringBlockTermIndent._M_dataplus._M_p,
                      tok.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tok.stringBlockIndent._M_dataplus._M_p != &tok.stringBlockIndent.field_2) {
      operator_delete(tok.stringBlockIndent._M_dataplus._M_p,
                      tok.stringBlockIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tok.data._M_dataplus._M_p != &tok.data.field_2) {
      operator_delete(tok.data._M_dataplus._M_p,tok.data.field_2._M_allocated_capacity + 1);
    }
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector(&tok.fodder);
    cond = parse(this,0xf);
    colonFodder.
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    colonFodder.
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colonFodder.
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    msg = (AST *)0x0;
    p_Var4 = (this->tokens->
             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>).
             _M_impl._M_node.super__List_node_base._M_next;
    if ((*(int *)&p_Var4[1]._M_next == 0xc) &&
       (iVar8 = std::__cxx11::string::compare((char *)(p_Var4 + 3)), iVar8 == 0)) {
      Token::Token(&semicolon,
                   (Token *)((this->tokens->
                             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                             )._M_impl._M_node.super__List_node_base._M_next + 1));
      std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
      _M_erase(this->tokens,
               (this->tokens->
               super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
               )._M_impl._M_node.super__List_node_base._M_next);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      operator=(&colonFodder,&semicolon.fodder);
      msg = parse(this,0xf);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)semicolon.location.file._M_dataplus._M_p != &semicolon.location.file.field_2) {
        operator_delete(semicolon.location.file._M_dataplus._M_p,
                        semicolon.location.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)semicolon.stringBlockTermIndent._M_dataplus._M_p !=
          &semicolon.stringBlockTermIndent.field_2) {
        operator_delete(semicolon.stringBlockTermIndent._M_dataplus._M_p,
                        semicolon.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)semicolon.stringBlockIndent._M_dataplus._M_p != &semicolon.stringBlockIndent.field_2) {
        operator_delete(semicolon.stringBlockIndent._M_dataplus._M_p,
                        semicolon.stringBlockIndent.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)semicolon.data._M_dataplus._M_p != &semicolon.data.field_2) {
        operator_delete(semicolon.data._M_dataplus._M_p,
                        semicolon.data.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&semicolon.fodder);
    }
    popExpect(&semicolon,this,SEMICOLON,(char *)0x0);
    pAVar12 = parse(this,0xf);
    _Var7._M_t.
    super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
    .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
         (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
         (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
         local_510;
    pAVar3 = this->alloc;
    pcVar5 = (((LocationRange *)
              ((long)local_510._M_t.
                     super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                     .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))
             ->file)._M_dataplus._M_p;
    rest = pAVar12;
    lit = (LiteralString *)local_3c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&lit,pcVar5,
               pcVar5 + (((LocationRange *)
                         ((long)local_510._M_t.
                                super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                _M_head_impl + 0x80))->file)._M_string_length);
    local_3c0._16_8_ =
         (((LocationRange *)
          ((long)_Var7._M_t.
                 super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                 .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))->
         begin).line;
    local_3c0._24_8_ =
         (((LocationRange *)
          ((long)_Var7._M_t.
                 super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                 .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))->
         begin).column;
    local_3c0._32_8_ = (pAVar12->location).end.line;
    local_3c0._40_8_ = (pAVar12->location).end.column;
    pFVar13 = (Function *)
              Allocator::
              make<jsonnet::internal::Assert,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&>
                        (pAVar3,(LocationRange *)&lit,
                         (Fodder *)
                         ((long)_Var7._M_t.
                                super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                _M_head_impl + 8),&cond,&colonFodder,&msg,&semicolon.fodder,&rest);
    if (lit != (LiteralString *)local_3c0) {
      operator_delete(lit,local_3c0._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.location.file._M_dataplus._M_p != &semicolon.location.file.field_2) {
      operator_delete(semicolon.location.file._M_dataplus._M_p,
                      semicolon.location.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.stringBlockTermIndent._M_dataplus._M_p !=
        &semicolon.stringBlockTermIndent.field_2) {
      operator_delete(semicolon.stringBlockTermIndent._M_dataplus._M_p,
                      semicolon.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.stringBlockIndent._M_dataplus._M_p != &semicolon.stringBlockIndent.field_2) {
      operator_delete(semicolon.stringBlockIndent._M_dataplus._M_p,
                      semicolon.stringBlockIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.data._M_dataplus._M_p != &semicolon.data.field_2) {
      operator_delete(semicolon.data._M_dataplus._M_p,
                      semicolon.data.field_2._M_allocated_capacity + 1);
    }
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector(&semicolon.fodder);
    args_2 = &colonFodder;
    break;
  default:
    goto LAB_0014fa9c;
  case ERROR:
    Token::Token(&tok,(Token *)((this->tokens->
                                super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                                )._M_impl._M_node.super__List_node_base._M_next + 1));
    std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
    _M_erase(this->tokens,
             (this->tokens->
             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>).
             _M_impl._M_node.super__List_node_base._M_next);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tok.location.file._M_dataplus._M_p != &tok.location.file.field_2) {
      operator_delete(tok.location.file._M_dataplus._M_p,
                      tok.location.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tok.stringBlockTermIndent._M_dataplus._M_p != &tok.stringBlockTermIndent.field_2) {
      operator_delete(tok.stringBlockTermIndent._M_dataplus._M_p,
                      tok.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tok.stringBlockIndent._M_dataplus._M_p != &tok.stringBlockIndent.field_2) {
      operator_delete(tok.stringBlockIndent._M_dataplus._M_p,
                      tok.stringBlockIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tok.data._M_dataplus._M_p != &tok.data.field_2) {
      operator_delete(tok.data._M_dataplus._M_p,tok.data.field_2._M_allocated_capacity + 1);
    }
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector(&tok.fodder);
    pLVar9 = (LiteralString *)parse(this,0xf);
    _Var7._M_t.
    super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
    .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
         (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
         (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
         local_510;
    pAVar3 = this->alloc;
    ppFVar2 = &semicolon.fodder.
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    pcVar5 = (((LocationRange *)
              ((long)local_510._M_t.
                     super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                     .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))
             ->file)._M_dataplus._M_p;
    semicolon._0_8_ = ppFVar2;
    lit = pLVar9;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&semicolon,pcVar5,
               pcVar5 + (((LocationRange *)
                         ((long)local_510._M_t.
                                super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                _M_head_impl + 0x80))->file)._M_string_length);
    semicolon.data._M_dataplus._M_p =
         (pointer)(((LocationRange *)
                   ((long)_Var7._M_t.
                          super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                          .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl +
                   0x80))->begin).line;
    semicolon.data._M_string_length =
         (((LocationRange *)
          ((long)_Var7._M_t.
                 super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                 .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))->
         begin).column;
    semicolon.data.field_2._M_allocated_capacity = (pLVar9->super_AST).location.end.line;
    semicolon.data.field_2._8_8_ = (pLVar9->super_AST).location.end.column;
    pFVar13 = (Function *)
              Allocator::
              make<jsonnet::internal::Error,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&>
                        (pAVar3,(LocationRange *)&semicolon,
                         (Fodder *)
                         ((long)_Var7._M_t.
                                super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                _M_head_impl + 8),(AST **)&lit);
    pvVar15 = (void *)semicolon._0_8_;
    if ((pointer *)semicolon._0_8_ == ppFVar2) goto LAB_0014fa8f;
    goto LAB_0014f934;
  case FUNCTION:
    Token::Token(&semicolon,
                 (Token *)((this->tokens->
                           super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                           )._M_impl._M_node.super__List_node_base._M_next + 1));
    std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
    _M_erase(this->tokens,
             (this->tokens->
             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>).
             _M_impl._M_node.super__List_node_base._M_next);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.location.file._M_dataplus._M_p != &semicolon.location.file.field_2) {
      operator_delete(semicolon.location.file._M_dataplus._M_p,
                      semicolon.location.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.stringBlockTermIndent._M_dataplus._M_p !=
        &semicolon.stringBlockTermIndent.field_2) {
      operator_delete(semicolon.stringBlockTermIndent._M_dataplus._M_p,
                      semicolon.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.stringBlockIndent._M_dataplus._M_p != &semicolon.stringBlockIndent.field_2) {
      operator_delete(semicolon.stringBlockIndent._M_dataplus._M_p,
                      semicolon.stringBlockIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.data._M_dataplus._M_p != &semicolon.data.field_2) {
      operator_delete(semicolon.data._M_dataplus._M_p,
                      semicolon.data.field_2._M_allocated_capacity + 1);
    }
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector(&semicolon.fodder);
    Token::Token((Token *)&lit,
                 (Token *)((this->tokens->
                           super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                           )._M_impl._M_node.super__List_node_base._M_next + 1));
    std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
    _M_erase(this->tokens,
             (this->tokens->
             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>).
             _M_impl._M_node.super__List_node_base._M_next);
    if ((int)lit != 7) {
      std::__cxx11::stringstream::stringstream((stringstream *)&tok);
      ppFVar2 = &tok.fodder.
                 super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)ppFVar2,"expected ( but got ",0x13);
      operator<<((ostream *)ppFVar2,(Token *)&lit);
      pSVar14 = (StaticError *)__cxa_allocate_exception(0x60);
      std::__cxx11::stringbuf::str();
      StaticError::StaticError(pSVar14,(LocationRange *)(local_360 + 0x10),(string *)&colonFodder);
      __cxa_throw(pSVar14,&StaticError::typeinfo,StaticError::~StaticError);
    }
    colonFodder.
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colonFodder.
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    colonFodder.
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ppFVar2 = &tok.fodder.
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    msg = (AST *)0x12;
    tok._0_8_ = ppFVar2;
    tok._0_8_ = std::__cxx11::string::_M_create((ulong *)&tok,(ulong)&msg);
    tok.fodder.
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)msg;
    builtin_strncpy((char *)tok._0_8_,"function parameter",0x12);
    tok.fodder.
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)msg;
    *(char *)(tok._0_8_ + (long)msg) = '\0';
    parseParams((ArgParams *)&cond,this,(string *)&tok,(bool *)&rest,&colonFodder);
    if ((pointer *)tok._0_8_ != ppFVar2) {
      operator_delete((void *)tok._0_8_,
                      (ulong)((long)&(tok.fodder.
                                      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                      ._M_impl.super__Vector_impl_data._M_finish)->kind + 1));
    }
    pAVar12 = parse(this,0xf);
    _Var7._M_t.
    super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
    .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
         (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
         (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
         local_510;
    pAVar3 = this->alloc;
    pcVar5 = (((LocationRange *)
              ((long)local_510._M_t.
                     super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                     .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))
             ->file)._M_dataplus._M_p;
    msg = pAVar12;
    tok._0_8_ = ppFVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&tok,pcVar5,
               pcVar5 + (((LocationRange *)
                         ((long)local_510._M_t.
                                super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                _M_head_impl + 0x80))->file)._M_string_length);
    tok.data._M_dataplus._M_p =
         (pointer)(((LocationRange *)
                   ((long)_Var7._M_t.
                          super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                          .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl +
                   0x80))->begin).line;
    tok.data._M_string_length =
         (((LocationRange *)
          ((long)_Var7._M_t.
                 super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                 .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))->
         begin).column;
    tok.data.field_2._M_allocated_capacity = (pAVar12->location).end.line;
    tok.data.field_2._8_8_ = (pAVar12->location).end.column;
    args_2 = (Fodder *)local_3c8;
    pFVar13 = Allocator::
              make<jsonnet::internal::Function,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>&,bool&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&>
                        (pAVar3,(LocationRange *)&tok,
                         (Fodder *)
                         ((long)_Var7._M_t.
                                super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                _M_head_impl + 8),args_2,
                         (vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                          *)&cond,(bool *)&rest,&colonFodder,&msg);
    if ((pointer *)tok._0_8_ != ppFVar2) {
      operator_delete((void *)tok._0_8_,
                      (ulong)((long)&(tok.fodder.
                                      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                      ._M_impl.super__Vector_impl_data._M_finish)->kind + 1));
    }
    std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::~vector
              ((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
               &cond);
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector(&colonFodder);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._16_8_ != local_340) {
      operator_delete((void *)local_360._16_8_,local_340[0]._M_allocated_capacity + 1);
    }
    if ((pointer)local_3c0._80_8_ != (pointer)local_360) {
      operator_delete((void *)local_3c0._80_8_,(ulong)(local_360._0_8_ + 1));
    }
    if ((undefined1 *)local_3c0._48_8_ != local_3c0 + 0x40) {
      operator_delete((void *)local_3c0._48_8_,local_3c0._64_8_ + 1);
    }
    if ((undefined1 *)local_3c0._16_8_ != local_3c0 + 0x20) {
      operator_delete((void *)local_3c0._16_8_,local_3c0._32_8_ + 1);
    }
    break;
  case IF:
    Token::Token(&tok,(Token *)((this->tokens->
                                super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                                )._M_impl._M_node.super__List_node_base._M_next + 1));
    std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
    _M_erase(this->tokens,
             (this->tokens->
             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>).
             _M_impl._M_node.super__List_node_base._M_next);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tok.location.file._M_dataplus._M_p != &tok.location.file.field_2) {
      operator_delete(tok.location.file._M_dataplus._M_p,
                      tok.location.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tok.stringBlockTermIndent._M_dataplus._M_p != &tok.stringBlockTermIndent.field_2) {
      operator_delete(tok.stringBlockTermIndent._M_dataplus._M_p,
                      tok.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tok.stringBlockIndent._M_dataplus._M_p != &tok.stringBlockIndent.field_2) {
      operator_delete(tok.stringBlockIndent._M_dataplus._M_p,
                      tok.stringBlockIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tok.data._M_dataplus._M_p != &tok.data.field_2) {
      operator_delete(tok.data._M_dataplus._M_p,tok.data.field_2._M_allocated_capacity + 1);
    }
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector(&tok.fodder);
    cond = parse(this,0xf);
    popExpect(&semicolon,this,THEN,(char *)0x0);
    pAVar12 = parse(this,0xf);
    _Var7._M_t.
    super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
    .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
         (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
         (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
         local_510;
    p_Var4 = (this->tokens->
             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>).
             _M_impl._M_node.super__List_node_base._M_next;
    msg = pAVar12;
    if (*(int *)&p_Var4[1]._M_next == 0x13) {
      Token::Token((Token *)&lit,(Token *)(p_Var4 + 1));
      std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
      _M_erase(this->tokens,
               (this->tokens->
               super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
               )._M_impl._M_node.super__List_node_base._M_next);
      pAVar12 = parse(this,0xf);
      _Var7._M_t.
      super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
      .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
           (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
           (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
           local_510;
      pAVar3 = this->alloc;
      ppFVar2 = &colonFodder.
                 super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pcVar5 = (((LocationRange *)
                ((long)local_510._M_t.
                       super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                       .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80
                ))->file)._M_dataplus._M_p;
      rest = pAVar12;
      colonFodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)ppFVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&colonFodder,pcVar5,
                 pcVar5 + (((LocationRange *)
                           ((long)local_510._M_t.
                                  super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                  .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                  _M_head_impl + 0x80))->file)._M_string_length);
      local_f8._M_allocated_capacity = (pAVar12->location).end.line;
      local_f8._8_8_ = (pAVar12->location).end.column;
      pFVar13 = (Function *)
                Allocator::
                make<jsonnet::internal::Conditional,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&>
                          (pAVar3,(LocationRange *)&colonFodder,
                           (Fodder *)
                           ((long)_Var7._M_t.
                                  super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                  .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                  _M_head_impl + 8),&cond,&semicolon.fodder,&msg,
                           (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            *)local_3c8,&rest);
      if (colonFodder.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)ppFVar2) {
        operator_delete(colonFodder.
                        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&(colonFodder.
                                        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->kind +
                               1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._16_8_ != local_340) {
        operator_delete((void *)local_360._16_8_,local_340[0]._M_allocated_capacity + 1);
      }
      if ((pointer)local_3c0._80_8_ != (pointer)local_360) {
        operator_delete((void *)local_3c0._80_8_,(ulong)(local_360._0_8_ + 1));
      }
      if ((undefined1 *)local_3c0._48_8_ != local_3c0 + 0x40) {
        operator_delete((void *)local_3c0._48_8_,local_3c0._64_8_ + 1);
      }
      if ((undefined1 *)local_3c0._16_8_ != local_3c0 + 0x20) {
        operator_delete((void *)local_3c0._16_8_,local_3c0._32_8_ + 1);
      }
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)local_3c8);
    }
    else {
      pAVar3 = this->alloc;
      pcVar5 = (((LocationRange *)
                ((long)local_510._M_t.
                       super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                       .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80
                ))->file)._M_dataplus._M_p;
      lit = (LiteralString *)local_3c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&lit,pcVar5,
                 pcVar5 + (((LocationRange *)
                           ((long)local_510._M_t.
                                  super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                  .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                  _M_head_impl + 0x80))->file)._M_string_length);
      local_3c0._16_8_ =
           (((LocationRange *)
            ((long)_Var7._M_t.
                   super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                   .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))->
           begin).line;
      local_3c0._24_8_ =
           (((LocationRange *)
            ((long)_Var7._M_t.
                   super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                   .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))->
           begin).column;
      local_3c0._32_8_ = (pAVar12->location).end.line;
      local_3c0._40_8_ = (pAVar12->location).end.column;
      colonFodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      colonFodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      colonFodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      rest = (AST *)0x0;
      pFVar13 = (Function *)
                Allocator::
                make<jsonnet::internal::Conditional,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>,decltype(nullptr)>
                          (pAVar3,(LocationRange *)&lit,
                           (Fodder *)
                           ((long)_Var7._M_t.
                                  super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                  .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                  _M_head_impl + 8),&cond,&semicolon.fodder,&msg,&colonFodder,&rest)
      ;
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&colonFodder);
      if (lit != (LiteralString *)local_3c0) {
        operator_delete(lit,local_3c0._0_8_ + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.location.file._M_dataplus._M_p != &semicolon.location.file.field_2) {
      operator_delete(semicolon.location.file._M_dataplus._M_p,
                      semicolon.location.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.stringBlockTermIndent._M_dataplus._M_p !=
        &semicolon.stringBlockTermIndent.field_2) {
      operator_delete(semicolon.stringBlockTermIndent._M_dataplus._M_p,
                      semicolon.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.stringBlockIndent._M_dataplus._M_p != &semicolon.stringBlockIndent.field_2) {
      operator_delete(semicolon.stringBlockIndent._M_dataplus._M_p,
                      semicolon.stringBlockIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.data._M_dataplus._M_p != &semicolon.data.field_2) {
      operator_delete(semicolon.data._M_dataplus._M_p,
                      semicolon.data.field_2._M_allocated_capacity + 1);
    }
    args_2 = &semicolon.fodder;
    break;
  case IMPORT:
    Token::Token(&semicolon,
                 (Token *)((this->tokens->
                           super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                           )._M_impl._M_node.super__List_node_base._M_next + 1));
    std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
    _M_erase(this->tokens,
             (this->tokens->
             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>).
             _M_impl._M_node.super__List_node_base._M_next);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.location.file._M_dataplus._M_p != &semicolon.location.file.field_2) {
      operator_delete(semicolon.location.file._M_dataplus._M_p,
                      semicolon.location.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.stringBlockTermIndent._M_dataplus._M_p !=
        &semicolon.stringBlockTermIndent.field_2) {
      operator_delete(semicolon.stringBlockTermIndent._M_dataplus._M_p,
                      semicolon.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.stringBlockIndent._M_dataplus._M_p != &semicolon.stringBlockIndent.field_2) {
      operator_delete(semicolon.stringBlockIndent._M_dataplus._M_p,
                      semicolon.stringBlockIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.data._M_dataplus._M_p != &semicolon.data.field_2) {
      operator_delete(semicolon.data._M_dataplus._M_p,
                      semicolon.data.field_2._M_allocated_capacity + 1);
    }
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector(&semicolon.fodder);
    pLVar9 = (LiteralString *)parse(this,0xf);
    _Var7._M_t.
    super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
    .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
         (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
         (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
         local_510;
    if ((pLVar9->super_AST).type != AST_LITERAL_STRING) {
      std::__cxx11::stringstream::stringstream((stringstream *)&tok);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 &tok.fodder.
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  ._M_impl.super__Vector_impl_data._M_finish,"computed imports are not allowed.",
                 0x21);
      pSVar14 = (StaticError *)__cxa_allocate_exception(0x60);
      std::__cxx11::stringbuf::str();
      StaticError::StaticError(pSVar14,&(pLVar9->super_AST).location,(string *)&lit);
      __cxa_throw(pSVar14,&StaticError::typeinfo,StaticError::~StaticError);
    }
    lit = pLVar9;
    if (pLVar9->tokenKind == BLOCK) {
      pSVar14 = (StaticError *)__cxa_allocate_exception(0x60);
      tok._0_8_ = &tok.fodder.
                   super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&tok,"Cannot use text blocks in import statements.","");
      StaticError::StaticError(pSVar14,&(pLVar9->super_AST).location,(string *)&tok);
      __cxa_throw(pSVar14,&StaticError::typeinfo,StaticError::~StaticError);
    }
    pAVar3 = this->alloc;
    tok._0_8_ = &tok.fodder.
                 super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    pcVar5 = (((LocationRange *)
              ((long)local_510._M_t.
                     super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                     .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))
             ->file)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&tok,pcVar5,
               pcVar5 + (((LocationRange *)
                         ((long)local_510._M_t.
                                super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                _M_head_impl + 0x80))->file)._M_string_length);
    tok.data._M_dataplus._M_p =
         (pointer)(((LocationRange *)
                   ((long)_Var7._M_t.
                          super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                          .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl +
                   0x80))->begin).line;
    tok.data._M_string_length =
         (((LocationRange *)
          ((long)_Var7._M_t.
                 super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                 .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))->
         begin).column;
    tok.data.field_2._M_allocated_capacity = (pLVar9->super_AST).location.end.line;
    tok.data.field_2._8_8_ = (pLVar9->super_AST).location.end.column;
    pFVar13 = (Function *)
              Allocator::
              make<jsonnet::internal::Import,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::LiteralString*&>
                        (pAVar3,(LocationRange *)&tok,
                         (Fodder *)
                         ((long)_Var7._M_t.
                                super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                _M_head_impl + 8),&lit);
    goto LAB_0014f918;
  case IMPORTSTR:
    Token::Token(&semicolon,
                 (Token *)((this->tokens->
                           super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                           )._M_impl._M_node.super__List_node_base._M_next + 1));
    std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
    _M_erase(this->tokens,
             (this->tokens->
             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>).
             _M_impl._M_node.super__List_node_base._M_next);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.location.file._M_dataplus._M_p != &semicolon.location.file.field_2) {
      operator_delete(semicolon.location.file._M_dataplus._M_p,
                      semicolon.location.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.stringBlockTermIndent._M_dataplus._M_p !=
        &semicolon.stringBlockTermIndent.field_2) {
      operator_delete(semicolon.stringBlockTermIndent._M_dataplus._M_p,
                      semicolon.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.stringBlockIndent._M_dataplus._M_p != &semicolon.stringBlockIndent.field_2) {
      operator_delete(semicolon.stringBlockIndent._M_dataplus._M_p,
                      semicolon.stringBlockIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.data._M_dataplus._M_p != &semicolon.data.field_2) {
      operator_delete(semicolon.data._M_dataplus._M_p,
                      semicolon.data.field_2._M_allocated_capacity + 1);
    }
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector(&semicolon.fodder);
    pLVar9 = (LiteralString *)parse(this,0xf);
    _Var7._M_t.
    super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
    .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
         (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
         (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
         local_510;
    if ((pLVar9->super_AST).type != AST_LITERAL_STRING) {
      std::__cxx11::stringstream::stringstream((stringstream *)&tok);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 &tok.fodder.
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  ._M_impl.super__Vector_impl_data._M_finish,"computed imports are not allowed.",
                 0x21);
      pSVar14 = (StaticError *)__cxa_allocate_exception(0x60);
      std::__cxx11::stringbuf::str();
      StaticError::StaticError(pSVar14,&(pLVar9->super_AST).location,(string *)&lit);
      __cxa_throw(pSVar14,&StaticError::typeinfo,StaticError::~StaticError);
    }
    lit = pLVar9;
    if (pLVar9->tokenKind == BLOCK) {
      pSVar14 = (StaticError *)__cxa_allocate_exception(0x60);
      tok._0_8_ = &tok.fodder.
                   super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&tok,"Cannot use text blocks in import statements.","");
      StaticError::StaticError(pSVar14,&(pLVar9->super_AST).location,(string *)&tok);
      __cxa_throw(pSVar14,&StaticError::typeinfo,StaticError::~StaticError);
    }
    pAVar3 = this->alloc;
    tok._0_8_ = &tok.fodder.
                 super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    pcVar5 = (((LocationRange *)
              ((long)local_510._M_t.
                     super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                     .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))
             ->file)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&tok,pcVar5,
               pcVar5 + (((LocationRange *)
                         ((long)local_510._M_t.
                                super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                _M_head_impl + 0x80))->file)._M_string_length);
    tok.data._M_dataplus._M_p =
         (pointer)(((LocationRange *)
                   ((long)_Var7._M_t.
                          super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                          .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl +
                   0x80))->begin).line;
    tok.data._M_string_length =
         (((LocationRange *)
          ((long)_Var7._M_t.
                 super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                 .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))->
         begin).column;
    tok.data.field_2._M_allocated_capacity = (pLVar9->super_AST).location.end.line;
    tok.data.field_2._8_8_ = (pLVar9->super_AST).location.end.column;
    pFVar13 = (Function *)
              Allocator::
              make<jsonnet::internal::Importstr,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::LiteralString*&>
                        (pAVar3,(LocationRange *)&tok,
                         (Fodder *)
                         ((long)_Var7._M_t.
                                super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                _M_head_impl + 8),&lit);
    goto LAB_0014f918;
  case IMPORTBIN:
    Token::Token(&semicolon,
                 (Token *)((this->tokens->
                           super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                           )._M_impl._M_node.super__List_node_base._M_next + 1));
    std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
    _M_erase(this->tokens,
             (this->tokens->
             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>).
             _M_impl._M_node.super__List_node_base._M_next);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.location.file._M_dataplus._M_p != &semicolon.location.file.field_2) {
      operator_delete(semicolon.location.file._M_dataplus._M_p,
                      semicolon.location.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.stringBlockTermIndent._M_dataplus._M_p !=
        &semicolon.stringBlockTermIndent.field_2) {
      operator_delete(semicolon.stringBlockTermIndent._M_dataplus._M_p,
                      semicolon.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.stringBlockIndent._M_dataplus._M_p != &semicolon.stringBlockIndent.field_2) {
      operator_delete(semicolon.stringBlockIndent._M_dataplus._M_p,
                      semicolon.stringBlockIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)semicolon.data._M_dataplus._M_p != &semicolon.data.field_2) {
      operator_delete(semicolon.data._M_dataplus._M_p,
                      semicolon.data.field_2._M_allocated_capacity + 1);
    }
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector(&semicolon.fodder);
    pLVar9 = (LiteralString *)parse(this,0xf);
    _Var7._M_t.
    super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
    .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
         (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
         (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
         local_510;
    if ((pLVar9->super_AST).type != AST_LITERAL_STRING) {
      std::__cxx11::stringstream::stringstream((stringstream *)&tok);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 &tok.fodder.
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  ._M_impl.super__Vector_impl_data._M_finish,"computed imports are not allowed.",
                 0x21);
      pSVar14 = (StaticError *)__cxa_allocate_exception(0x60);
      std::__cxx11::stringbuf::str();
      StaticError::StaticError(pSVar14,&(pLVar9->super_AST).location,(string *)&lit);
      __cxa_throw(pSVar14,&StaticError::typeinfo,StaticError::~StaticError);
    }
    lit = pLVar9;
    if (pLVar9->tokenKind == BLOCK) {
      pSVar14 = (StaticError *)__cxa_allocate_exception(0x60);
      tok._0_8_ = &tok.fodder.
                   super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&tok,"Cannot use text blocks in import statements.","");
      StaticError::StaticError(pSVar14,&(pLVar9->super_AST).location,(string *)&tok);
      __cxa_throw(pSVar14,&StaticError::typeinfo,StaticError::~StaticError);
    }
    pAVar3 = this->alloc;
    tok._0_8_ = &tok.fodder.
                 super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    pcVar5 = (((LocationRange *)
              ((long)local_510._M_t.
                     super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                     .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))
             ->file)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&tok,pcVar5,
               pcVar5 + (((LocationRange *)
                         ((long)local_510._M_t.
                                super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                _M_head_impl + 0x80))->file)._M_string_length);
    tok.data._M_dataplus._M_p =
         (pointer)(((LocationRange *)
                   ((long)_Var7._M_t.
                          super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                          .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl +
                   0x80))->begin).line;
    tok.data._M_string_length =
         (((LocationRange *)
          ((long)_Var7._M_t.
                 super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                 .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))->
         begin).column;
    tok.data.field_2._M_allocated_capacity = (pLVar9->super_AST).location.end.line;
    tok.data.field_2._8_8_ = (pLVar9->super_AST).location.end.column;
    pFVar13 = (Function *)
              Allocator::
              make<jsonnet::internal::Importbin,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::LiteralString*&>
                        (pAVar3,(LocationRange *)&tok,
                         (Fodder *)
                         ((long)_Var7._M_t.
                                super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                _M_head_impl + 8),&lit);
LAB_0014f918:
    semicolon.fodder.
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         tok.fodder.
         super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pvVar15 = (void *)tok._0_8_;
    if ((pointer *)tok._0_8_ !=
        &tok.fodder.
         super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0014f934:
      operator_delete(pvVar15,(ulong)((long)&(semicolon.fodder.
                                              super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                              ._M_impl.super__Vector_impl_data._M_finish)->kind + 1)
                     );
    }
    goto LAB_0014fa8f;
  case LOCAL:
    Token::Token((Token *)&lit,
                 (Token *)((this->tokens->
                           super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                           )._M_impl._M_node.super__List_node_base._M_next + 1));
    std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
    _M_erase(this->tokens,
             (this->tokens->
             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>).
             _M_impl._M_node.super__List_node_base._M_next);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._16_8_ != local_340) {
      operator_delete((void *)local_360._16_8_,local_340[0]._M_allocated_capacity + 1);
    }
    if ((pointer)local_3c0._80_8_ != (pointer)local_360) {
      operator_delete((void *)local_3c0._80_8_,(ulong)(local_360._0_8_ + 1));
    }
    if ((undefined1 *)local_3c0._48_8_ != local_3c0 + 0x40) {
      operator_delete((void *)local_3c0._48_8_,local_3c0._64_8_ + 1);
    }
    if ((undefined1 *)local_3c0._16_8_ != local_3c0 + 0x20) {
      operator_delete((void *)local_3c0._16_8_,local_3c0._32_8_ + 1);
    }
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)local_3c8);
    binds.
    super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    binds.
    super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    binds.
    super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    paVar1 = &semicolon.location.file.field_2;
    do {
      popExpect(&tok,this,IDENTIFIER,(char *)0x0);
      pAVar3 = this->alloc;
      Token::data32_abi_cxx11_((UString *)&semicolon,&tok);
      pIVar10 = Allocator::makeIdentifier(pAVar3,(UString *)&semicolon);
      pBVar11 = binds.
                super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((pointer *)semicolon._0_8_ !=
          &semicolon.fodder.
           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
        operator_delete((void *)semicolon._0_8_,
                        (long)semicolon.fodder.
                              super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              ._M_impl.super__Vector_impl_data._M_finish * 4 + 4);
        pBVar11 = binds.
                  super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      for (; id = pIVar10,
          pBVar11 !=
          binds.
          super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
          ._M_impl.super__Vector_impl_data._M_finish; pBVar11 = pBVar11 + 1) {
        if (pBVar11->var == pIVar10) {
          pSVar14 = (StaticError *)__cxa_allocate_exception(0x60);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &semicolon,"duplicate local var: ",&tok.data);
          StaticError::StaticError(pSVar14,&tok.location,(string *)&semicolon);
          __cxa_throw(pSVar14,&StaticError::typeinfo,StaticError::~StaticError);
        }
      }
      is_function = false;
      local_418 = (pointer)0x0;
      rest = (AST *)0x0;
      pAStack_420 = (pointer)0x0;
      trailing_comma = false;
      fodder_l.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      fodder_l.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      fodder_l.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      fodder_r.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      fodder_r.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      fodder_r.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      p_Var4 = (this->tokens->
               super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
               )._M_impl._M_node.super__List_node_base._M_next;
      if (*(int *)&p_Var4[1]._M_next == 7) {
        Token::Token(&semicolon,(Token *)(p_Var4 + 1));
        std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
        _M_erase(this->tokens,
                 (this->tokens->
                 super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                 )._M_impl._M_node.super__List_node_base._M_next);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::operator=(&fodder_l,&semicolon.fodder);
        cond = (AST *)&local_4f8;
        msg = (AST *)0x12;
        cond = (AST *)std::__cxx11::string::_M_create((ulong *)&cond,(ulong)&msg);
        local_4f8._M_allocated_capacity = (size_type)msg;
        cond->_vptr_AST = (_func_int **)0x6e6f6974636e7566;
        (cond->location).file._M_dataplus._M_p = (pointer)0x74656d6172617020;
        *(undefined2 *)&(cond->location).file._M_string_length = 0x7265;
        local_500 = msg;
        *(undefined1 *)((long)&msg->_vptr_AST + (long)&cond->_vptr_AST) = 0;
        parseParams(&local_68,this,(string *)&cond,&trailing_comma,&fodder_r);
        local_3f8 = local_418;
        pAStack_400 = pAStack_420;
        msg = rest;
        local_418 = local_68.
                    super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        rest = (AST *)local_68.
                      super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        pAStack_420 = local_68.
                      super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
        local_68.
        super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.
        super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68.
        super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
        ~vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *
                )&msg);
        std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
        ~vector(&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)cond != &local_4f8) {
          operator_delete(cond,(ulong)(local_4f8._M_allocated_capacity + 1));
        }
        is_function = true;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)semicolon.location.file._M_dataplus._M_p != paVar1) {
          operator_delete(semicolon.location.file._M_dataplus._M_p,
                          semicolon.location.file.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)semicolon.stringBlockTermIndent._M_dataplus._M_p !=
            &semicolon.stringBlockTermIndent.field_2) {
          operator_delete(semicolon.stringBlockTermIndent._M_dataplus._M_p,
                          semicolon.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)semicolon.stringBlockIndent._M_dataplus._M_p != &semicolon.stringBlockIndent.field_2)
        {
          operator_delete(semicolon.stringBlockIndent._M_dataplus._M_p,
                          semicolon.stringBlockIndent.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)semicolon.data._M_dataplus._M_p != &semicolon.data.field_2) {
          operator_delete(semicolon.data._M_dataplus._M_p,
                          semicolon.data.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(&semicolon.fodder);
      }
      popExpect(&semicolon,this,OPERATOR,"=");
      cond = parse(this,0xf);
      Token::Token((Token *)&colonFodder,
                   (Token *)((this->tokens->
                             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                             )._M_impl._M_node.super__List_node_base._M_next + 1));
      std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
      _M_erase(this->tokens,
               (this->tokens->
               super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
               )._M_impl._M_node.super__List_node_base._M_next);
      std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>::
      emplace_back<std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Identifier_const*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,bool&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>&,bool&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                ((vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>
                  *)&binds,&tok.fodder,&id,&semicolon.fodder,&cond,&is_function,&fodder_l,
                 (vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                  *)&rest,&trailing_comma,&fodder_r,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)&colonFodder.
                     super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)semicolon.location.file._M_dataplus._M_p != paVar1) {
        operator_delete(semicolon.location.file._M_dataplus._M_p,
                        semicolon.location.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)semicolon.stringBlockTermIndent._M_dataplus._M_p !=
          &semicolon.stringBlockTermIndent.field_2) {
        operator_delete(semicolon.stringBlockTermIndent._M_dataplus._M_p,
                        semicolon.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)semicolon.stringBlockIndent._M_dataplus._M_p != &semicolon.stringBlockIndent.field_2) {
        operator_delete(semicolon.stringBlockIndent._M_dataplus._M_p,
                        semicolon.stringBlockIndent.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)semicolon.data._M_dataplus._M_p != &semicolon.data.field_2) {
        operator_delete(semicolon.data._M_dataplus._M_p,
                        semicolon.data.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&semicolon.fodder);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&fodder_r);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&fodder_l);
      std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
      ~vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
              &rest);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tok.location.file._M_dataplus._M_p != &tok.location.file.field_2) {
        operator_delete(tok.location.file._M_dataplus._M_p,
                        tok.location.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tok.stringBlockTermIndent._M_dataplus._M_p != &tok.stringBlockTermIndent.field_2) {
        operator_delete(tok.stringBlockTermIndent._M_dataplus._M_p,
                        tok.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tok.stringBlockIndent._M_dataplus._M_p != &tok.stringBlockIndent.field_2) {
        operator_delete(tok.stringBlockIndent._M_dataplus._M_p,
                        tok.stringBlockIndent.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tok.data._M_dataplus._M_p != &tok.data.field_2) {
        operator_delete(tok.data._M_dataplus._M_p,tok.data.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&tok.fodder);
      if ((int)colonFodder.
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ._M_impl.super__Vector_impl_data._M_start == 4) {
        bVar6 = true;
      }
      else {
        if ((int)colonFodder.
                 super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                 ._M_impl.super__Vector_impl_data._M_start != 9) {
          std::__cxx11::stringstream::stringstream((stringstream *)&tok);
          ppFVar2 = &tok.fodder.
                     super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppFVar2,"expected , or ; but got ",0x18);
          operator<<((ostream *)ppFVar2,(Token *)&colonFodder);
          pSVar14 = (StaticError *)__cxa_allocate_exception(0x60);
          std::__cxx11::stringbuf::str();
          StaticError::StaticError(pSVar14,&local_a8,(string *)&semicolon);
          __cxa_throw(pSVar14,&StaticError::typeinfo,StaticError::~StaticError);
        }
        bVar6 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.file._M_dataplus._M_p != &local_a8.file.field_2) {
        operator_delete(local_a8.file._M_dataplus._M_p,
                        local_a8.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_p != &local_b8) {
        operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_p != &local_d8) {
        operator_delete(local_e8._M_p,local_d8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_p != &local_f8) {
        operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
      }
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)&colonFodder.
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
    } while (bVar6);
    pAVar12 = parse(this,0xf);
    _Var7._M_t.
    super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
    .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
         (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
         (tuple<jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>)
         local_510;
    pAVar3 = this->alloc;
    ppFVar2 = &tok.fodder.
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    pcVar5 = (((LocationRange *)
              ((long)local_510._M_t.
                     super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                     .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))
             ->file)._M_dataplus._M_p;
    semicolon._0_8_ = pAVar12;
    tok._0_8_ = ppFVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&tok,pcVar5,
               pcVar5 + (((LocationRange *)
                         ((long)local_510._M_t.
                                super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                _M_head_impl + 0x80))->file)._M_string_length);
    tok.data._M_dataplus._M_p =
         (pointer)(((LocationRange *)
                   ((long)_Var7._M_t.
                          super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                          .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl +
                   0x80))->begin).line;
    tok.data._M_string_length =
         (((LocationRange *)
          ((long)_Var7._M_t.
                 super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                 .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl + 0x80))->
         begin).column;
    tok.data.field_2._M_allocated_capacity = (pAVar12->location).end.line;
    tok.data.field_2._8_8_ = (pAVar12->location).end.column;
    pFVar13 = (Function *)
              Allocator::
              make<jsonnet::internal::Local,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>&,jsonnet::internal::AST*&>
                        (pAVar3,(LocationRange *)&tok,
                         (Fodder *)
                         ((long)_Var7._M_t.
                                super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                _M_head_impl + 8),&binds,(AST **)&semicolon);
    if ((pointer *)tok._0_8_ != ppFVar2) {
      operator_delete((void *)tok._0_8_,
                      (ulong)((long)&(tok.fodder.
                                      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                      ._M_impl.super__Vector_impl_data._M_finish)->kind + 1));
    }
    std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
    ~vector(&binds);
    goto LAB_0014fa8f;
  }
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  ~vector(args_2);
LAB_0014fa8f:
  if ((__uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>)
      begin_._M_t.
      super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
      ._M_t.
      super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
      .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>)0x0
     ) {
LAB_0014fa9c:
    std::default_delete<jsonnet::internal::Token>::operator()
              ((default_delete<jsonnet::internal::Token> *)&begin_,
               (Token *)begin_._M_t.
                        super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                        .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl);
  }
  if (pFVar13 == (Function *)0x0) {
    this_01 = (Token *)operator_new(0xc0);
    Token::Token(this_01,(Token *)((this->tokens->
                                   super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                                   )._M_impl._M_node.super__List_node_base._M_next + 1));
    tok._0_8_ = this_01;
    pAVar12 = parseTerminalBracketsOrUnary(this);
    pFVar13 = (Function *)parseInfix(this,pAVar12,this_01,max_precedence);
    if (tok._0_8_ != 0) {
      std::default_delete<jsonnet::internal::Token>::operator()
                ((default_delete<jsonnet::internal::Token> *)&tok,(Token *)tok._0_8_);
    }
  }
  return &pFVar13->super_AST;
}

Assistant:

AST *parse(unsigned max_precedence)
    {
        AST *ast = maybeParseGreedy();
        // There cannot be an operator after a greedy parse.
        if (ast != nullptr) return ast;

        // If we get here, we could be parsing an infix construct.

        // Allocate this on the heap to control stack growth.
        std::unique_ptr<Token> begin_(new Token(peek()));
        const Token &begin = *begin_;

        AST *lhs = parseTerminalBracketsOrUnary();

        return parseInfix(lhs, begin, max_precedence);
    }